

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O3

User * __thiscall Database::getUserById(User *__return_storage_ptr__,Database *this,int id)

{
  uint uVar1;
  int iVar2;
  long *plVar3;
  DatabaseException *pDVar4;
  uint uVar5;
  size_type *psVar6;
  long *plVar7;
  ulong uVar8;
  uint __val;
  uint __len;
  char *errorMsg;
  string error;
  string query;
  string __str;
  char *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d8 = (char *)0x0;
  (__return_storage_ptr__->username)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->username).field_2;
  (__return_storage_ptr__->username)._M_string_length = 0;
  (__return_storage_ptr__->username).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->alias)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->alias).field_2;
  (__return_storage_ptr__->alias)._M_string_length = 0;
  (__return_storage_ptr__->alias).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->bio)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->bio).field_2;
  (__return_storage_ptr__->bio)._M_string_length = 0;
  (__return_storage_ptr__->bio).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->password)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->password).field_2;
  (__return_storage_ptr__->password)._M_string_length = 0;
  (__return_storage_ptr__->password).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->id = 0;
  __val = -id;
  if (0 < id) {
    __val = id;
  }
  __len = 1;
  if (9 < __val) {
    uVar8 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar5 = (uint)uVar8;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_001a1ba3;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_001a1ba3;
      }
      if (uVar5 < 10000) goto LAB_001a1ba3;
      uVar8 = uVar8 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar5);
    __len = __len + 1;
  }
LAB_001a1ba3:
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct((ulong)local_90,(char)__len - (char)(id >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_90[0] + ((uint)id >> 0x1f),__len,__val);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_90,0,(char *)0x0,0x1b44ec);
  psVar6 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_d0.field_2._M_allocated_capacity = *psVar6;
    local_d0.field_2._8_8_ = plVar3[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar6;
    local_d0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_d0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
  plVar7 = plVar3 + 2;
  if ((long *)*plVar3 == plVar7) {
    local_a0 = *plVar7;
    lStack_98 = plVar3[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar7;
    local_b0 = (long *)*plVar3;
  }
  local_a8 = plVar3[1];
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  iVar2 = sqlite3_exec(this->database,(char *)local_b0,make_user_callback,__return_storage_ptr__,
                       &local_d8);
  if (iVar2 == 0) {
    if (__return_storage_ptr__->id != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"User got successfully",0x15);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
      std::ostream::put('\x18');
      std::ostream::flush();
      if (local_b0 != &local_a0) {
        operator_delete(local_b0);
      }
      return __return_storage_ptr__;
    }
    pDVar4 = (DatabaseException *)__cxa_allocate_exception(0x28);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"User not found","");
    DatabaseException::DatabaseException(pDVar4,&local_70);
    __cxa_throw(pDVar4,&DatabaseException::typeinfo,DatabaseException::~DatabaseException);
  }
  std::__cxx11::string::string((string *)&local_d0,local_d8,(allocator *)local_90);
  sqlite3_free(local_d8);
  pDVar4 = (DatabaseException *)__cxa_allocate_exception(0x28);
  std::operator+(&local_50,"Error while getting user by id: ",&local_d0);
  DatabaseException::DatabaseException(pDVar4,&local_50);
  __cxa_throw(pDVar4,&DatabaseException::typeinfo,DatabaseException::~DatabaseException);
}

Assistant:

User Database::getUserById(int id)
{
	char* errorMsg = nullptr;
	User result;
	std::string query = "select * from users where id = " + std::to_string(id) + ";";

	int failure = sqlite3_exec(database, query.c_str(), make_user_callback, &result, &errorMsg);

	if(failure)
	{
		std::string error(errorMsg);
		sqlite3_free(errorMsg);
		throw DatabaseException("Error while getting user by id: " + error);
	}
	else if(result.isEmpty())
	{
		throw DatabaseException("User not found");
	}
	else
	{
		std::cout << "User got successfully" << std::endl;
		return result;
	}
}